

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void analyzeOneTable(Parse *pParse,Table *pTab,Index *pOnlyIdx,int iStatCur,int iMem,int iTab)

{
  sqlite3 *db_00;
  bool bVar1;
  byte bVar2;
  i16 iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  int addr;
  int iVar7;
  int iVar8;
  int p2;
  int addr_00;
  Vdbe *p;
  void *p_00;
  CollSeq *zP4;
  Index *pIVar9;
  int iVar10;
  int p2_00;
  int p3;
  int iDest;
  int p2_01;
  int p1;
  int local_fc;
  int local_f8;
  int local_f4;
  int local_f0;
  int local_ec;
  u8 seekOp;
  int addrIsNull;
  int addrNext;
  int regSampleRowid;
  int regCol;
  int regSample;
  int regDLt;
  int regLt;
  int regEq;
  int regKey;
  int k;
  int j;
  Index *pPk;
  char *pColl;
  int *aGotoChng;
  int endDistinctTest;
  int nColTest;
  char *zIdxName;
  int addrNextRow;
  int addrRewind;
  int nCol;
  int regPrev;
  int regStat1;
  int regIdxname;
  int regTabname;
  int regTemp;
  int regRowid;
  int regChng;
  int regStat4;
  int regNewRowid;
  u8 needTableCnt;
  int iDb;
  int jZeroRows;
  int i;
  Vdbe *v;
  int iTabCur;
  int iIdxCur;
  Index *pIdx;
  sqlite3 *db;
  int iTab_local;
  int iMem_local;
  int iStatCur_local;
  Index *pOnlyIdx_local;
  Table *pTab_local;
  Parse *pParse_local;
  
  db_00 = pParse->db;
  bVar1 = true;
  iVar10 = iMem + 1;
  p2_00 = iMem + 2;
  p3 = iMem + 4;
  iDest = iMem + 5;
  p2_01 = iMem + 7;
  p1 = iMem + 8;
  local_ec = p1;
  if (p1 < pParse->nMem) {
    local_ec = pParse->nMem;
  }
  pParse->nMem = local_ec;
  p = sqlite3GetVdbe(pParse);
  if ((((p != (Vdbe *)0x0) && (pTab != (Table *)0x0)) && (pTab->tnum != 0)) &&
     (iVar4 = sqlite3_strlike("sqlite\\_%",pTab->zName,0x5c), iVar4 != 0)) {
    iVar4 = sqlite3SchemaToIndex(db_00,pTab->pSchema);
    iVar5 = sqlite3AuthCheck(pParse,0x1c,pTab->zName,(char *)0x0,db_00->aDb[iVar4].zDbSName);
    if (iVar5 == 0) {
      sqlite3TableLock(pParse,iVar4,pTab->tnum,'\0',pTab->zName);
      iVar5 = iTab + 1;
      local_f0 = iTab + 2;
      if (local_f0 < pParse->nTab) {
        local_f0 = pParse->nTab;
      }
      pParse->nTab = local_f0;
      sqlite3OpenTable(pParse,iTab,iVar4,pTab,0x6c);
      sqlite3VdbeLoadString(p,iDest,pTab->zName);
      for (_iTabCur = pTab->pIndex; _iTabCur != (Index *)0x0; _iTabCur = _iTabCur->pNext) {
        if ((pOnlyIdx == (Index *)0x0) || (pOnlyIdx == _iTabCur)) {
          if (_iTabCur->pPartIdxWhere == (Expr *)0x0) {
            bVar1 = false;
          }
          if (((pTab->tabFlags & 0x20) == 0) || ((*(ushort *)&_iTabCur->field_0x63 & 3) != 2)) {
            addrNextRow = (int)_iTabCur->nColumn;
            _endDistinctTest = _iTabCur->zName;
            uVar6 = addrNextRow;
            if ((*(ushort *)&_iTabCur->field_0x63 >> 3 & 1) != 0) {
              uVar6 = (uint)_iTabCur->nKeyCol;
            }
            local_f4 = uVar6 - 1;
            aGotoChng._4_4_ = local_f4;
          }
          else {
            addrNextRow = (int)_iTabCur->nKeyCol;
            _endDistinctTest = pTab->zName;
            aGotoChng._4_4_ = addrNextRow - 1;
          }
          sqlite3VdbeLoadString(p,iMem + 6,_endDistinctTest);
          if (p1 + aGotoChng._4_4_ < pParse->nMem) {
            local_f8 = pParse->nMem;
          }
          else {
            local_f8 = p1 + aGotoChng._4_4_;
          }
          pParse->nMem = local_f8;
          sqlite3VdbeAddOp3(p,0x6c,iVar5,_iTabCur->tnum,iVar4);
          sqlite3VdbeSetP4KeyInfo(pParse,_iTabCur);
          sqlite3VdbeAddOp2(p,0x5d,iVar5,iMem + 4);
          sqlite3VdbeAddOp2(p,0x46,addrNextRow,iMem + 2);
          sqlite3VdbeAddOp2(p,0x46,(uint)_iTabCur->nKeyCol,iMem + 3);
          sqlite3VdbeAddOp4(p,0x3f,0,iMem + 2,iVar10,&statInitFuncdef.nArg,-8);
          sqlite3VdbeChangeP5(p,3);
          addr = sqlite3VdbeAddOp1(p,0x24,iVar5);
          sqlite3VdbeAddOp2(p,0x46,0,p2_00);
          zIdxName._0_4_ = sqlite3VdbeCurrentAddr(p);
          if (0 < aGotoChng._4_4_) {
            iVar7 = sqlite3VdbeMakeLabel(pParse);
            p_00 = sqlite3DbMallocRawNN(db_00,(long)aGotoChng._4_4_ << 2);
            if (p_00 == (void *)0x0) goto LAB_001c393b;
            sqlite3VdbeAddOp0(p,0xb);
            zIdxName._0_4_ = sqlite3VdbeCurrentAddr(p);
            if (((aGotoChng._4_4_ == 1) && (_iTabCur->nKeyCol == 1)) && (_iTabCur->onError != '\0'))
            {
              sqlite3VdbeAddOp2(p,0x33,p1,iVar7);
            }
            for (iDb = 0; iDb < aGotoChng._4_4_; iDb = iDb + 1) {
              zP4 = sqlite3LocateCollSeq(pParse,_iTabCur->azColl[iDb]);
              sqlite3VdbeAddOp2(p,0x46,iDb,p2_00);
              sqlite3VdbeAddOp3(p,0x5a,iVar5,iDb,p3);
              iVar8 = sqlite3VdbeAddOp4(p,0x34,p3,0,p1 + iDb,(char *)zP4,-2);
              *(int *)((long)p_00 + (long)iDb * 4) = iVar8;
              sqlite3VdbeChangeP5(p,0x80);
            }
            sqlite3VdbeAddOp2(p,0x46,aGotoChng._4_4_,p2_00);
            sqlite3VdbeGoto(p,iVar7);
            sqlite3VdbeJumpHere(p,(int)zIdxName + -1);
            for (iDb = 0; iDb < aGotoChng._4_4_; iDb = iDb + 1) {
              sqlite3VdbeJumpHere(p,*(int *)((long)p_00 + (long)iDb * 4));
              sqlite3VdbeAddOp3(p,0x5a,iVar5,iDb,p1 + iDb);
            }
            sqlite3VdbeResolveLabel(p,iVar7);
            sqlite3DbFree(db_00,p_00);
          }
          if ((pTab->tabFlags & 0x20) == 0) {
            sqlite3VdbeAddOp2(p,0x87,iVar5,iMem + 3);
          }
          else {
            pIVar9 = sqlite3PrimaryKeyIndex(_iTabCur->pTable);
            iVar7 = sqlite3GetTempRange(pParse,(uint)pIVar9->nKeyCol);
            for (regKey = 0; regKey < (int)(uint)pIVar9->nKeyCol; regKey = regKey + 1) {
              iVar3 = sqlite3ColumnOfIndex(_iTabCur,pIVar9->aiColumn[regKey]);
              sqlite3VdbeAddOp3(p,0x5a,iVar5,(int)iVar3,iVar7 + regKey);
            }
            sqlite3VdbeAddOp3(p,0x5c,iVar7,(uint)pIVar9->nKeyCol,iMem + 3);
            sqlite3ReleaseTempRange(pParse,iVar7,(uint)pIVar9->nKeyCol);
          }
          sqlite3VdbeAddOp4(p,0x3f,1,iVar10,p3,&statPushFuncdef.nArg,-8);
          sqlite3VdbeChangeP5(p,3);
          sqlite3VdbeAddOp2(p,5,iVar5,(int)zIdxName);
          callStatGet(p,iVar10,0,p2_01);
          sqlite3VdbeAddOp4(p,0x5c,iDest,3,p3,"BBB",0);
          sqlite3VdbeAddOp2(p,0x79,iStatCur,iMem);
          sqlite3VdbeAddOp3(p,0x7a,iStatCur,p3,iMem);
          sqlite3VdbeChangeP5(p,8);
          iVar7 = iMem + 0xb;
          iVar8 = iVar7 + addrNextRow;
          bVar2 = 0x1c;
          if ((pTab->tabFlags & 0x20) == 0) {
            bVar2 = 0x1f;
          }
          if (iVar7 + addrNextRow < pParse->nMem) {
            local_fc = pParse->nMem;
          }
          else {
            local_fc = iVar7 + addrNextRow;
          }
          pParse->nMem = local_fc;
          p2 = sqlite3VdbeCurrentAddr(p);
          callStatGet(p,iVar10,1,iVar8);
          addr_00 = sqlite3VdbeAddOp1(p,0x32,iVar8);
          callStatGet(p,iVar10,2,p2_01);
          callStatGet(p,iVar10,3,iMem + 8);
          callStatGet(p,iVar10,4,iMem + 9);
          sqlite3VdbeAddOp4Int(p,(uint)bVar2,iTab,p2,iVar8,0);
          for (iDb = 0; iDb < addrNextRow; iDb = iDb + 1) {
            sqlite3ExprCodeLoadIndexColumn(pParse,_iTabCur,iTab,iDb,iVar7 + iDb);
          }
          sqlite3VdbeAddOp3(p,0x5c,iVar7,addrNextRow,iMem + 10);
          sqlite3VdbeAddOp3(p,0x5c,iDest,6,p3);
          sqlite3VdbeAddOp2(p,0x79,iStatCur + 1,iMem);
          sqlite3VdbeAddOp3(p,0x7a,iStatCur + 1,p3,iMem);
          sqlite3VdbeAddOp2(p,0xb,1,p2);
          sqlite3VdbeJumpHere(p,addr_00);
          sqlite3VdbeJumpHere(p,addr);
        }
LAB_001c393b:
      }
      if ((pOnlyIdx == (Index *)0x0) && (bVar1)) {
        sqlite3VdbeAddOp2(p,0x5d,iTab,p2_01);
        iVar10 = sqlite3VdbeAddOp1(p,0x14,p2_01);
        sqlite3VdbeAddOp2(p,0x49,0,iMem + 6);
        sqlite3VdbeAddOp4(p,0x5c,iDest,3,p3,"BBB",0);
        sqlite3VdbeAddOp2(p,0x79,iStatCur,iMem);
        sqlite3VdbeAddOp3(p,0x7a,iStatCur,p3,iMem);
        sqlite3VdbeChangeP5(p,8);
        sqlite3VdbeJumpHere(p,iVar10);
      }
    }
  }
  return;
}

Assistant:

static void analyzeOneTable(
  Parse *pParse,   /* Parser context */
  Table *pTab,     /* Table whose indices are to be analyzed */
  Index *pOnlyIdx, /* If not NULL, only analyze this one index */
  int iStatCur,    /* Index of VdbeCursor that writes the sqlite_stat1 table */
  int iMem,        /* Available memory locations begin here */
  int iTab         /* Next available cursor */
){
  sqlite3 *db = pParse->db;    /* Database handle */
  Index *pIdx;                 /* An index to being analyzed */
  int iIdxCur;                 /* Cursor open on index being analyzed */
  int iTabCur;                 /* Table cursor */
  Vdbe *v;                     /* The virtual machine being built up */
  int i;                       /* Loop counter */
  int jZeroRows = -1;          /* Jump from here if number of rows is zero */
  int iDb;                     /* Index of database containing pTab */
  u8 needTableCnt = 1;         /* True to count the table */
  int regNewRowid = iMem++;    /* Rowid for the inserted record */
  int regStat4 = iMem++;       /* Register to hold Stat4Accum object */
  int regChng = iMem++;        /* Index of changed index field */
#ifdef SQLITE_ENABLE_STAT3_OR_STAT4
  int regRowid = iMem++;       /* Rowid argument passed to stat_push() */
#endif
  int regTemp = iMem++;        /* Temporary use register */
  int regTabname = iMem++;     /* Register containing table name */
  int regIdxname = iMem++;     /* Register containing index name */
  int regStat1 = iMem++;       /* Value for the stat column of sqlite_stat1 */
  int regPrev = iMem;          /* MUST BE LAST (see below) */
#ifdef SQLITE_ENABLE_PREUPDATE_HOOK
  Table *pStat1 = 0; 
#endif

  pParse->nMem = MAX(pParse->nMem, iMem);
  v = sqlite3GetVdbe(pParse);
  if( v==0 || NEVER(pTab==0) ){
    return;
  }
  if( pTab->tnum==0 ){
    /* Do not gather statistics on views or virtual tables */
    return;
  }
  if( sqlite3_strlike("sqlite\\_%", pTab->zName, '\\')==0 ){
    /* Do not gather statistics on system tables */
    return;
  }
  assert( sqlite3BtreeHoldsAllMutexes(db) );
  iDb = sqlite3SchemaToIndex(db, pTab->pSchema);
  assert( iDb>=0 );
  assert( sqlite3SchemaMutexHeld(db, iDb, 0) );
#ifndef SQLITE_OMIT_AUTHORIZATION
  if( sqlite3AuthCheck(pParse, SQLITE_ANALYZE, pTab->zName, 0,
      db->aDb[iDb].zDbSName ) ){
    return;
  }
#endif

#ifdef SQLITE_ENABLE_PREUPDATE_HOOK
  if( db->xPreUpdateCallback ){
    pStat1 = (Table*)sqlite3DbMallocZero(db, sizeof(Table) + 13);
    if( pStat1==0 ) return;
    pStat1->zName = (char*)&pStat1[1];
    memcpy(pStat1->zName, "sqlite_stat1", 13);
    pStat1->nCol = 3;
    pStat1->iPKey = -1;
    sqlite3VdbeAddOp4(pParse->pVdbe, OP_Noop, 0, 0, 0,(char*)pStat1,P4_DYNBLOB);
  }
#endif

  /* Establish a read-lock on the table at the shared-cache level. 
  ** Open a read-only cursor on the table. Also allocate a cursor number
  ** to use for scanning indexes (iIdxCur). No index cursor is opened at
  ** this time though.  */
  sqlite3TableLock(pParse, iDb, pTab->tnum, 0, pTab->zName);
  iTabCur = iTab++;
  iIdxCur = iTab++;
  pParse->nTab = MAX(pParse->nTab, iTab);
  sqlite3OpenTable(pParse, iTabCur, iDb, pTab, OP_OpenRead);
  sqlite3VdbeLoadString(v, regTabname, pTab->zName);

  for(pIdx=pTab->pIndex; pIdx; pIdx=pIdx->pNext){
    int nCol;                     /* Number of columns in pIdx. "N" */
    int addrRewind;               /* Address of "OP_Rewind iIdxCur" */
    int addrNextRow;              /* Address of "next_row:" */
    const char *zIdxName;         /* Name of the index */
    int nColTest;                 /* Number of columns to test for changes */

    if( pOnlyIdx && pOnlyIdx!=pIdx ) continue;
    if( pIdx->pPartIdxWhere==0 ) needTableCnt = 0;
    if( !HasRowid(pTab) && IsPrimaryKeyIndex(pIdx) ){
      nCol = pIdx->nKeyCol;
      zIdxName = pTab->zName;
      nColTest = nCol - 1;
    }else{
      nCol = pIdx->nColumn;
      zIdxName = pIdx->zName;
      nColTest = pIdx->uniqNotNull ? pIdx->nKeyCol-1 : nCol-1;
    }

    /* Populate the register containing the index name. */
    sqlite3VdbeLoadString(v, regIdxname, zIdxName);
    VdbeComment((v, "Analysis for %s.%s", pTab->zName, zIdxName));

    /*
    ** Pseudo-code for loop that calls stat_push():
    **
    **   Rewind csr
    **   if eof(csr) goto end_of_scan;
    **   regChng = 0
    **   goto chng_addr_0;
    **
    **  next_row:
    **   regChng = 0
    **   if( idx(0) != regPrev(0) ) goto chng_addr_0
    **   regChng = 1
    **   if( idx(1) != regPrev(1) ) goto chng_addr_1
    **   ...
    **   regChng = N
    **   goto chng_addr_N
    **
    **  chng_addr_0:
    **   regPrev(0) = idx(0)
    **  chng_addr_1:
    **   regPrev(1) = idx(1)
    **  ...
    **
    **  endDistinctTest:
    **   regRowid = idx(rowid)
    **   stat_push(P, regChng, regRowid)
    **   Next csr
    **   if !eof(csr) goto next_row;
    **
    **  end_of_scan:
    */

    /* Make sure there are enough memory cells allocated to accommodate 
    ** the regPrev array and a trailing rowid (the rowid slot is required
    ** when building a record to insert into the sample column of 
    ** the sqlite_stat4 table.  */
    pParse->nMem = MAX(pParse->nMem, regPrev+nColTest);

    /* Open a read-only cursor on the index being analyzed. */
    assert( iDb==sqlite3SchemaToIndex(db, pIdx->pSchema) );
    sqlite3VdbeAddOp3(v, OP_OpenRead, iIdxCur, pIdx->tnum, iDb);
    sqlite3VdbeSetP4KeyInfo(pParse, pIdx);
    VdbeComment((v, "%s", pIdx->zName));

    /* Invoke the stat_init() function. The arguments are:
    ** 
    **    (1) the number of columns in the index including the rowid
    **        (or for a WITHOUT ROWID table, the number of PK columns),
    **    (2) the number of columns in the key without the rowid/pk
    **    (3) the number of rows in the index,
    **
    **
    ** The third argument is only used for STAT3 and STAT4
    */
#ifdef SQLITE_ENABLE_STAT3_OR_STAT4
    sqlite3VdbeAddOp2(v, OP_Count, iIdxCur, regStat4+3);
#endif
    sqlite3VdbeAddOp2(v, OP_Integer, nCol, regStat4+1);
    sqlite3VdbeAddOp2(v, OP_Integer, pIdx->nKeyCol, regStat4+2);
    sqlite3VdbeAddOp4(v, OP_Function0, 0, regStat4+1, regStat4,
                     (char*)&statInitFuncdef, P4_FUNCDEF);
    sqlite3VdbeChangeP5(v, 2+IsStat34);

    /* Implementation of the following:
    **
    **   Rewind csr
    **   if eof(csr) goto end_of_scan;
    **   regChng = 0
    **   goto next_push_0;
    **
    */
    addrRewind = sqlite3VdbeAddOp1(v, OP_Rewind, iIdxCur);
    VdbeCoverage(v);
    sqlite3VdbeAddOp2(v, OP_Integer, 0, regChng);
    addrNextRow = sqlite3VdbeCurrentAddr(v);

    if( nColTest>0 ){
      int endDistinctTest = sqlite3VdbeMakeLabel(pParse);
      int *aGotoChng;               /* Array of jump instruction addresses */
      aGotoChng = sqlite3DbMallocRawNN(db, sizeof(int)*nColTest);
      if( aGotoChng==0 ) continue;

      /*
      **  next_row:
      **   regChng = 0
      **   if( idx(0) != regPrev(0) ) goto chng_addr_0
      **   regChng = 1
      **   if( idx(1) != regPrev(1) ) goto chng_addr_1
      **   ...
      **   regChng = N
      **   goto endDistinctTest
      */
      sqlite3VdbeAddOp0(v, OP_Goto);
      addrNextRow = sqlite3VdbeCurrentAddr(v);
      if( nColTest==1 && pIdx->nKeyCol==1 && IsUniqueIndex(pIdx) ){
        /* For a single-column UNIQUE index, once we have found a non-NULL
        ** row, we know that all the rest will be distinct, so skip 
        ** subsequent distinctness tests. */
        sqlite3VdbeAddOp2(v, OP_NotNull, regPrev, endDistinctTest);
        VdbeCoverage(v);
      }
      for(i=0; i<nColTest; i++){
        char *pColl = (char*)sqlite3LocateCollSeq(pParse, pIdx->azColl[i]);
        sqlite3VdbeAddOp2(v, OP_Integer, i, regChng);
        sqlite3VdbeAddOp3(v, OP_Column, iIdxCur, i, regTemp);
        aGotoChng[i] = 
        sqlite3VdbeAddOp4(v, OP_Ne, regTemp, 0, regPrev+i, pColl, P4_COLLSEQ);
        sqlite3VdbeChangeP5(v, SQLITE_NULLEQ);
        VdbeCoverage(v);
      }
      sqlite3VdbeAddOp2(v, OP_Integer, nColTest, regChng);
      sqlite3VdbeGoto(v, endDistinctTest);
  
  
      /*
      **  chng_addr_0:
      **   regPrev(0) = idx(0)
      **  chng_addr_1:
      **   regPrev(1) = idx(1)
      **  ...
      */
      sqlite3VdbeJumpHere(v, addrNextRow-1);
      for(i=0; i<nColTest; i++){
        sqlite3VdbeJumpHere(v, aGotoChng[i]);
        sqlite3VdbeAddOp3(v, OP_Column, iIdxCur, i, regPrev+i);
      }
      sqlite3VdbeResolveLabel(v, endDistinctTest);
      sqlite3DbFree(db, aGotoChng);
    }
  
    /*
    **  chng_addr_N:
    **   regRowid = idx(rowid)            // STAT34 only
    **   stat_push(P, regChng, regRowid)  // 3rd parameter STAT34 only
    **   Next csr
    **   if !eof(csr) goto next_row;
    */
#ifdef SQLITE_ENABLE_STAT3_OR_STAT4
    assert( regRowid==(regStat4+2) );
    if( HasRowid(pTab) ){
      sqlite3VdbeAddOp2(v, OP_IdxRowid, iIdxCur, regRowid);
    }else{
      Index *pPk = sqlite3PrimaryKeyIndex(pIdx->pTable);
      int j, k, regKey;
      regKey = sqlite3GetTempRange(pParse, pPk->nKeyCol);
      for(j=0; j<pPk->nKeyCol; j++){
        k = sqlite3ColumnOfIndex(pIdx, pPk->aiColumn[j]);
        assert( k>=0 && k<pIdx->nColumn );
        sqlite3VdbeAddOp3(v, OP_Column, iIdxCur, k, regKey+j);
        VdbeComment((v, "%s", pTab->aCol[pPk->aiColumn[j]].zName));
      }
      sqlite3VdbeAddOp3(v, OP_MakeRecord, regKey, pPk->nKeyCol, regRowid);
      sqlite3ReleaseTempRange(pParse, regKey, pPk->nKeyCol);
    }
#endif
    assert( regChng==(regStat4+1) );
    sqlite3VdbeAddOp4(v, OP_Function0, 1, regStat4, regTemp,
                     (char*)&statPushFuncdef, P4_FUNCDEF);
    sqlite3VdbeChangeP5(v, 2+IsStat34);
    sqlite3VdbeAddOp2(v, OP_Next, iIdxCur, addrNextRow); VdbeCoverage(v);

    /* Add the entry to the stat1 table. */
    callStatGet(v, regStat4, STAT_GET_STAT1, regStat1);
    assert( "BBB"[0]==SQLITE_AFF_TEXT );
    sqlite3VdbeAddOp4(v, OP_MakeRecord, regTabname, 3, regTemp, "BBB", 0);
    sqlite3VdbeAddOp2(v, OP_NewRowid, iStatCur, regNewRowid);
    sqlite3VdbeAddOp3(v, OP_Insert, iStatCur, regTemp, regNewRowid);
#ifdef SQLITE_ENABLE_PREUPDATE_HOOK
    sqlite3VdbeChangeP4(v, -1, (char*)pStat1, P4_TABLE);
#endif
    sqlite3VdbeChangeP5(v, OPFLAG_APPEND);

    /* Add the entries to the stat3 or stat4 table. */
#ifdef SQLITE_ENABLE_STAT3_OR_STAT4
    {
      int regEq = regStat1;
      int regLt = regStat1+1;
      int regDLt = regStat1+2;
      int regSample = regStat1+3;
      int regCol = regStat1+4;
      int regSampleRowid = regCol + nCol;
      int addrNext;
      int addrIsNull;
      u8 seekOp = HasRowid(pTab) ? OP_NotExists : OP_NotFound;

      pParse->nMem = MAX(pParse->nMem, regCol+nCol);

      addrNext = sqlite3VdbeCurrentAddr(v);
      callStatGet(v, regStat4, STAT_GET_ROWID, regSampleRowid);
      addrIsNull = sqlite3VdbeAddOp1(v, OP_IsNull, regSampleRowid);
      VdbeCoverage(v);
      callStatGet(v, regStat4, STAT_GET_NEQ, regEq);
      callStatGet(v, regStat4, STAT_GET_NLT, regLt);
      callStatGet(v, regStat4, STAT_GET_NDLT, regDLt);
      sqlite3VdbeAddOp4Int(v, seekOp, iTabCur, addrNext, regSampleRowid, 0);
      VdbeCoverage(v);
#ifdef SQLITE_ENABLE_STAT3
      sqlite3ExprCodeLoadIndexColumn(pParse, pIdx, iTabCur, 0, regSample);
#else
      for(i=0; i<nCol; i++){
        sqlite3ExprCodeLoadIndexColumn(pParse, pIdx, iTabCur, i, regCol+i);
      }
      sqlite3VdbeAddOp3(v, OP_MakeRecord, regCol, nCol, regSample);
#endif
      sqlite3VdbeAddOp3(v, OP_MakeRecord, regTabname, 6, regTemp);
      sqlite3VdbeAddOp2(v, OP_NewRowid, iStatCur+1, regNewRowid);
      sqlite3VdbeAddOp3(v, OP_Insert, iStatCur+1, regTemp, regNewRowid);
      sqlite3VdbeAddOp2(v, OP_Goto, 1, addrNext); /* P1==1 for end-of-loop */
      sqlite3VdbeJumpHere(v, addrIsNull);
    }
#endif /* SQLITE_ENABLE_STAT3_OR_STAT4 */

    /* End of analysis */
    sqlite3VdbeJumpHere(v, addrRewind);
  }


  /* Create a single sqlite_stat1 entry containing NULL as the index
  ** name and the row count as the content.
  */
  if( pOnlyIdx==0 && needTableCnt ){
    VdbeComment((v, "%s", pTab->zName));
    sqlite3VdbeAddOp2(v, OP_Count, iTabCur, regStat1);
    jZeroRows = sqlite3VdbeAddOp1(v, OP_IfNot, regStat1); VdbeCoverage(v);
    sqlite3VdbeAddOp2(v, OP_Null, 0, regIdxname);
    assert( "BBB"[0]==SQLITE_AFF_TEXT );
    sqlite3VdbeAddOp4(v, OP_MakeRecord, regTabname, 3, regTemp, "BBB", 0);
    sqlite3VdbeAddOp2(v, OP_NewRowid, iStatCur, regNewRowid);
    sqlite3VdbeAddOp3(v, OP_Insert, iStatCur, regTemp, regNewRowid);
    sqlite3VdbeChangeP5(v, OPFLAG_APPEND);
#ifdef SQLITE_ENABLE_PREUPDATE_HOOK
    sqlite3VdbeChangeP4(v, -1, (char*)pStat1, P4_TABLE);
#endif
    sqlite3VdbeJumpHere(v, jZeroRows);
  }
}